

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O0

uchar * nvpair_unpack_binary(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  int *piVar1;
  void *__dest;
  void *value;
  size_t *leftp_local;
  uchar *ptr_local;
  nvpair_t *nvp_local;
  uchar *puStack_10;
  _Bool isbe_local;
  
  if (nvp->nvp_type == 7) {
    if ((*leftp < nvp->nvp_datasize) || (nvp->nvp_datasize == 0)) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      puStack_10 = (uchar *)0x0;
    }
    else {
      __dest = malloc(nvp->nvp_datasize);
      if (__dest == (void *)0x0) {
        puStack_10 = (uchar *)0x0;
      }
      else {
        memcpy(__dest,ptr,nvp->nvp_datasize);
        puStack_10 = ptr + nvp->nvp_datasize;
        *leftp = *leftp - nvp->nvp_datasize;
        nvp->nvp_data = (uint64_t)__dest;
      }
    }
    return puStack_10;
  }
  __assert_fail("nvp->nvp_type == 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                ,0x35b,
                "const unsigned char *nvpair_unpack_binary(_Bool, nvpair_t *, const unsigned char *, size_t *)"
               );
}

Assistant:

const unsigned char *
nvpair_unpack_binary(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp)
{
	void *value;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_BINARY);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(nvp->nvp_datasize);
	if (value == NULL)
		return (NULL);

	memcpy(value, ptr, nvp->nvp_datasize);
	ptr += nvp->nvp_datasize;
	*leftp -= nvp->nvp_datasize;

	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
}